

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Souperify.cpp
# Opt level: O1

void __thiscall wasm::DataFlow::Printer::print(Printer *this,Node *node)

{
  pointer ppNVar1;
  pointer ppNVar2;
  Node *this_00;
  int iVar3;
  ostream *poVar4;
  Type type;
  size_type sVar5;
  ulong uVar6;
  uint uVar7;
  ulong uVar8;
  ulong uVar9;
  Node *local_48;
  Node *block;
  Node *node_local;
  
  block = node;
  block = getMaybeReplaced(this,node);
  if (block == (Node *)0x0) {
    __assert_fail("node",
                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/passes/Souperify.cpp"
                  ,0x1c9,"void wasm::DataFlow::Printer::print(Node *)");
  }
  switch(block->type) {
  case Var:
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"%",1);
    std::__detail::
    _Map_base<wasm::DataFlow::Node_*,_std::pair<wasm::DataFlow::Node_*const,_unsigned_int>,_std::allocator<std::pair<wasm::DataFlow::Node_*const,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<wasm::DataFlow::Node_*>,_std::hash<wasm::DataFlow::Node_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
    ::operator[]((_Map_base<wasm::DataFlow::Node_*,_std::pair<wasm::DataFlow::Node_*const,_unsigned_int>,_std::allocator<std::pair<wasm::DataFlow::Node_*const,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<wasm::DataFlow::Node_*>,_std::hash<wasm::DataFlow::Node_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                  *)&this->indexing,&block);
    poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,":",1);
    poVar4 = wasm::operator<<(poVar4,(Type)(block->field_1).wasmType.id);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4," = var",6);
    goto LAB_00b4f777;
  case Expr:
    iVar3 = debug();
    if (iVar3 != 0) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"; ",2);
      poVar4 = std::operator<<((ostream *)&std::cout,(block->field_1).expr);
      local_48 = (Node *)CONCAT71(local_48._1_7_,10);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,(char *)&local_48,1);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"%",1);
    std::__detail::
    _Map_base<wasm::DataFlow::Node_*,_std::pair<wasm::DataFlow::Node_*const,_unsigned_int>,_std::allocator<std::pair<wasm::DataFlow::Node_*const,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<wasm::DataFlow::Node_*>,_std::hash<wasm::DataFlow::Node_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
    ::operator[]((_Map_base<wasm::DataFlow::Node_*,_std::pair<wasm::DataFlow::Node_*const,_unsigned_int>,_std::allocator<std::pair<wasm::DataFlow::Node_*const,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<wasm::DataFlow::Node_*>,_std::hash<wasm::DataFlow::Node_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                  *)&this->indexing,&block);
    poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4," = ",3);
    printExpression(this,block);
    goto LAB_00b4f777;
  case Phi:
    ppNVar2 = (block->values).
              super__Vector_base<wasm::DataFlow::Node_*,_std::allocator<wasm::DataFlow::Node_*>_>.
              _M_impl.super__Vector_impl_data._M_start;
    if ((block->values).
        super__Vector_base<wasm::DataFlow::Node_*,_std::allocator<wasm::DataFlow::Node_*>_>._M_impl.
        super__Vector_impl_data._M_finish != ppNVar2) {
      local_48 = *ppNVar2;
      ppNVar2 = (local_48->values).
                super__Vector_base<wasm::DataFlow::Node_*,_std::allocator<wasm::DataFlow::Node_*>_>.
                _M_impl.super__Vector_impl_data._M_finish;
      ppNVar1 = (local_48->values).
                super__Vector_base<wasm::DataFlow::Node_*,_std::allocator<wasm::DataFlow::Node_*>_>.
                _M_impl.super__Vector_impl_data._M_start;
      uVar8 = 1;
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"%",1);
      std::__detail::
      _Map_base<wasm::DataFlow::Node_*,_std::pair<wasm::DataFlow::Node_*const,_unsigned_int>,_std::allocator<std::pair<wasm::DataFlow::Node_*const,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<wasm::DataFlow::Node_*>,_std::hash<wasm::DataFlow::Node_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
      ::operator[]((_Map_base<wasm::DataFlow::Node_*,_std::pair<wasm::DataFlow::Node_*const,_unsigned_int>,_std::allocator<std::pair<wasm::DataFlow::Node_*const,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<wasm::DataFlow::Node_*>,_std::hash<wasm::DataFlow::Node_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                    *)&this->indexing,&block);
      poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4," = phi %",8);
      std::__detail::
      _Map_base<wasm::DataFlow::Node_*,_std::pair<wasm::DataFlow::Node_*const,_unsigned_int>,_std::allocator<std::pair<wasm::DataFlow::Node_*const,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<wasm::DataFlow::Node_*>,_std::hash<wasm::DataFlow::Node_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
      ::operator[]((_Map_base<wasm::DataFlow::Node_*,_std::pair<wasm::DataFlow::Node_*const,_unsigned_int>,_std::allocator<std::pair<wasm::DataFlow::Node_*const,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<wasm::DataFlow::Node_*>,_std::hash<wasm::DataFlow::Node_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                    *)&this->indexing,&local_48);
      std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
      uVar9 = ((long)ppNVar2 - (long)ppNVar1 >> 3) + 1;
      if (1 < uVar9) {
        uVar7 = 2;
        do {
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,", ",2);
          ppNVar2 = (block->values).
                    super__Vector_base<wasm::DataFlow::Node_*,_std::allocator<wasm::DataFlow::Node_*>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          uVar6 = (long)(block->values).
                        super__Vector_base<wasm::DataFlow::Node_*,_std::allocator<wasm::DataFlow::Node_*>_>
                        ._M_impl.super__Vector_impl_data._M_finish - (long)ppNVar2 >> 3;
          if (uVar6 <= uVar8) goto LAB_00b4f816;
          printInternal(this,ppNVar2[uVar8]);
          uVar8 = (ulong)uVar7;
          uVar7 = uVar7 + 1;
        } while (uVar8 < uVar9);
      }
      goto LAB_00b4f777;
    }
    break;
  case Cond:
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"blockpc %",9);
    ppNVar2 = (block->values).
              super__Vector_base<wasm::DataFlow::Node_*,_std::allocator<wasm::DataFlow::Node_*>_>.
              _M_impl.super__Vector_impl_data._M_start;
    if ((block->values).
        super__Vector_base<wasm::DataFlow::Node_*,_std::allocator<wasm::DataFlow::Node_*>_>._M_impl.
        super__Vector_impl_data._M_finish != ppNVar2) {
      local_48 = *ppNVar2;
      std::__detail::
      _Map_base<wasm::DataFlow::Node_*,_std::pair<wasm::DataFlow::Node_*const,_unsigned_int>,_std::allocator<std::pair<wasm::DataFlow::Node_*const,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<wasm::DataFlow::Node_*>,_std::hash<wasm::DataFlow::Node_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
      ::operator[]((_Map_base<wasm::DataFlow::Node_*,_std::pair<wasm::DataFlow::Node_*const,_unsigned_int>,_std::allocator<std::pair<wasm::DataFlow::Node_*const,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<wasm::DataFlow::Node_*>,_std::hash<wasm::DataFlow::Node_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                    *)&this->indexing,&local_48);
      poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
      node_local._7_1_ = 0x20;
      poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar4,(char *)((long)&node_local + 7),1);
      poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
      node_local._7_1_ = 0x20;
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,(char *)((long)&node_local + 7),1);
      ppNVar2 = (block->values).
                super__Vector_base<wasm::DataFlow::Node_*,_std::allocator<wasm::DataFlow::Node_*>_>.
                _M_impl.super__Vector_impl_data._M_start;
      uVar6 = (long)(block->values).
                    super__Vector_base<wasm::DataFlow::Node_*,_std::allocator<wasm::DataFlow::Node_*>_>
                    ._M_impl.super__Vector_impl_data._M_finish - (long)ppNVar2 >> 3;
      if (1 < uVar6) {
        printInternal(this,ppNVar2[1]);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," 1:i1",5);
        goto LAB_00b4f777;
      }
      uVar8 = 1;
      goto LAB_00b4f816;
    }
    break;
  case Block:
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"%",1);
    std::__detail::
    _Map_base<wasm::DataFlow::Node_*,_std::pair<wasm::DataFlow::Node_*const,_unsigned_int>,_std::allocator<std::pair<wasm::DataFlow::Node_*const,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<wasm::DataFlow::Node_*>,_std::hash<wasm::DataFlow::Node_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
    ::operator[]((_Map_base<wasm::DataFlow::Node_*,_std::pair<wasm::DataFlow::Node_*const,_unsigned_int>,_std::allocator<std::pair<wasm::DataFlow::Node_*const,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<wasm::DataFlow::Node_*>,_std::hash<wasm::DataFlow::Node_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                  *)&this->indexing,&block);
    poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4," = block ",9);
    std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
LAB_00b4f777:
    if (((block->type - Expr < 2) && (block->origin != this->trace->toInfer->origin)) &&
       (sVar5 = std::
                _Hashtable<wasm::DataFlow::Node_*,_wasm::DataFlow::Node_*,_std::allocator<wasm::DataFlow::Node_*>,_std::__detail::_Identity,_std::equal_to<wasm::DataFlow::Node_*>,_std::hash<wasm::DataFlow::Node_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                ::count(&(this->trace->hasExternalUses)._M_h,&block), sVar5 != 0)) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout," (hasExternalUses)",0x12);
      this->printedHasExternalUses = true;
    }
    local_48 = (Node *)CONCAT71(local_48._1_7_,10);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,(char *)&local_48,1);
    iVar3 = debug();
    if ((iVar3 != 0) && (block->type - Expr < 2)) {
      warnOnSuspiciousValues(this,block);
    }
    return;
  case Zext:
    ppNVar2 = (block->values).
              super__Vector_base<wasm::DataFlow::Node_*,_std::allocator<wasm::DataFlow::Node_*>_>.
              _M_impl.super__Vector_impl_data._M_start;
    if ((block->values).
        super__Vector_base<wasm::DataFlow::Node_*,_std::allocator<wasm::DataFlow::Node_*>_>._M_impl.
        super__Vector_impl_data._M_finish != ppNVar2) {
      this_00 = *ppNVar2;
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"%",1);
      std::__detail::
      _Map_base<wasm::DataFlow::Node_*,_std::pair<wasm::DataFlow::Node_*const,_unsigned_int>,_std::allocator<std::pair<wasm::DataFlow::Node_*const,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<wasm::DataFlow::Node_*>,_std::hash<wasm::DataFlow::Node_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
      ::operator[]((_Map_base<wasm::DataFlow::Node_*,_std::pair<wasm::DataFlow::Node_*const,_unsigned_int>,_std::allocator<std::pair<wasm::DataFlow::Node_*const,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<wasm::DataFlow::Node_*>,_std::hash<wasm::DataFlow::Node_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                    *)&this->indexing,&block);
      poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
      local_48 = (Node *)CONCAT71(local_48._1_7_,0x3a);
      poVar4 = std::__ostream_insert<char,std::char_traits<char>>(poVar4,(char *)&local_48,1);
      type = Node::getWasmType(this_00);
      wasm::operator<<(poVar4,type);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," = zext ",8);
      printInternal(this,this_00);
      goto LAB_00b4f777;
    }
    break;
  case Bad:
    handle_unreachable("!!!BAD!!!",
                       "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/passes/Souperify.cpp"
                       ,0x1f6);
  default:
    handle_unreachable("unexpted type",
                       "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/passes/Souperify.cpp"
                       ,0x1f9);
  }
  uVar8 = 0;
  uVar6 = 0;
LAB_00b4f816:
  std::__throw_out_of_range_fmt
            ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",uVar8,uVar6
            );
}

Assistant:

void print(Node* node) {
    // The node may have been replaced during trace building, if so then
    // print the proper replacement.
    node = getMaybeReplaced(node);
    assert(node);
    switch (node->type) {
      case Node::Type::Var: {
        std::cout << "%" << indexing[node] << ":" << node->wasmType << " = var";
        break; // nothing more to add
      }
      case Node::Type::Expr: {
        if (debug()) {
          std::cout << "; ";
          std::cout << *node->expr << '\n';
        }
        std::cout << "%" << indexing[node] << " = ";
        printExpression(node);
        break;
      }
      case Node::Type::Phi: {
        auto* block = node->getValue(0);
        auto size = block->values.size();
        std::cout << "%" << indexing[node] << " = phi %" << indexing[block];
        for (Index i = 1; i < size + 1; i++) {
          std::cout << ", ";
          printInternal(node->getValue(i));
        }
        break;
      }
      case Node::Type::Cond: {
        std::cout << "blockpc %" << indexing[node->getValue(0)] << ' '
                  << node->index << ' ';
        printInternal(node->getValue(1));
        std::cout << " 1:i1";
        break;
      }
      case Node::Type::Block: {
        std::cout << "%" << indexing[node] << " = block "
                  << node->values.size();
        break;
      }
      case Node::Type::Zext: {
        auto* child = node->getValue(0);
        std::cout << "%" << indexing[node] << ':' << child->getWasmType();
        std::cout << " = zext ";
        printInternal(child);
        break;
      }
      case Node::Type::Bad: {
        WASM_UNREACHABLE("!!!BAD!!!");
      }
      default:
        WASM_UNREACHABLE("unexpted type");
    }
    if (node->isExpr() || node->isPhi()) {
      if (node->origin != trace.toInfer->origin &&
          trace.hasExternalUses.count(node) > 0) {
        std::cout << " (hasExternalUses)";
        printedHasExternalUses = true;
      }
    }
    std::cout << '\n';
    if (debug() && (node->isExpr() || node->isPhi())) {
      warnOnSuspiciousValues(node);
    }
  }